

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_endian.c
# Opt level: O0

void test_convert_htobe16(void)

{
  uint16_t local_10 [4];
  uint16_t check;
  uint16_t check_pattern;
  uint16_t pattern;
  uint8_t pattern_array [2];
  
  local_10[3] = 0x3412;
  local_10[2] = 0x3412;
  local_10[1] = 0x1234;
  local_10[0] = cio_htobe16(0x3412);
  UnityAssertEqualMemory
            (local_10 + 1,local_10,2,1,"16 bit endian conversion incorrect!",0x41,
             UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_convert_htobe16(void)
{
	uint8_t pattern_array[] = {0x12, 0x34};
	uint16_t pattern;
	memcpy(&pattern, pattern_array, sizeof(pattern));
	uint16_t check_pattern = 0x1234;

	uint16_t check = cio_htobe16(pattern);

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(&check_pattern, &check, sizeof(check), "16 bit endian conversion incorrect!");
}